

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# staleblock.cc
# Opt level: O0

void fdb_add_inmem_stale_info
               (fdb_kvs_handle *handle,filemgr_header_revnum_t revnum,docio_object *doc,
               uint64_t doc_offset,bool system_doc_only)

{
  __int_type _Var1;
  list_elem *e;
  list_elem *plVar2;
  list_elem *in_RCX;
  docio_length *in_RDX;
  avl_node *in_RSI;
  long in_RDI;
  byte in_R8B;
  stale_info_entry *entry;
  stale_info_commit query;
  stale_info_commit *item;
  avl_node *a;
  filemgr *file;
  size_t buflen;
  memory_order in_stack_ffffffffffffff70;
  undefined4 in_stack_ffffffffffffff74;
  undefined1 __i;
  __atomic_base<unsigned_long> *in_stack_ffffffffffffff78;
  avl_node *in_stack_ffffffffffffff80;
  avl_tree *in_stack_ffffffffffffff88;
  avl_node *in_stack_ffffffffffffff90;
  avl_tree *in_stack_ffffffffffffff98;
  avl_node *local_48;
  uint local_30;
  
  __i = (undefined1)((uint)in_stack_ffffffffffffff74 >> 0x18);
  local_30 = 0;
  if (((*(long *)(in_RDI + 0x48) == 0) || (*(long *)(*(long *)(in_RDI + 0x48) + 0x110) == 0)) ||
     ((_Var1 = std::__atomic_base::operator_cast_to_unsigned_long(in_stack_ffffffffffffff78),
      _Var1 != 0 &&
      (_Var1 = std::__atomic_base::operator_cast_to_unsigned_long(in_stack_ffffffffffffff78),
      _Var1 != 100)))) {
    local_48 = avl_search(in_stack_ffffffffffffff88,in_stack_ffffffffffffff80,
                          (avl_cmp_func *)in_stack_ffffffffffffff78);
    if (local_48 == (avl_node *)0x0) {
      local_48 = (avl_node *)calloc(1,0x30);
      local_48[1].parent = in_RSI;
      list_init((list *)&local_48[1].left);
      avl_insert(in_stack_ffffffffffffff98,in_stack_ffffffffffffff90,
                 (avl_cmp_func *)in_stack_ffffffffffffff88);
      std::atomic<bool>::store
                ((atomic<bool> *)in_stack_ffffffffffffff78,(bool)__i,in_stack_ffffffffffffff70);
    }
    e = (list_elem *)calloc(1,0x30);
    if ((in_R8B & 1) == 0) {
      local_30 = in_RDX->bodylen;
      plVar2 = (list_elem *)calloc(1,(ulong)local_30);
      e[1].prev = plVar2;
      memcpy(e[1].prev,*(void **)(in_RDX + 3),(ulong)in_RDX->bodylen);
      *(uint32_t *)&e[2].next = in_RDX->bodylen;
    }
    else {
      e[1].prev = (list_elem *)0x0;
      *(undefined4 *)&e[2].next = 0;
    }
    *(uint *)((long)&e[2].next + 4) = local_30;
    plVar2 = (list_elem *)_fdb_get_docsize(*in_RDX);
    e[2].prev = plVar2;
    e[1].next = in_RCX;
    list_push_back((list *)&local_48[1].left,e);
  }
  return;
}

Assistant:

static void fdb_add_inmem_stale_info(fdb_kvs_handle *handle,
                                     filemgr_header_revnum_t revnum,
                                     struct docio_object *doc,
                                     uint64_t doc_offset,
                                     bool system_doc_only)
{
    size_t buflen = 0;
    struct filemgr *file = handle->file;
    struct avl_node *a;
    struct stale_info_commit *item, query;
    struct stale_info_entry *entry;

    if (file && file->config) {
        if ( file->config->block_reusing_threshold == 0 ||
             file->config->block_reusing_threshold == 100 ) {
            // Block reuse is disabled,
            // we don't need to maintain stale info in-memory.
            return;
        }
    }

    // search using revnum first
    query.revnum = revnum;
    a = avl_search(&file->stale_info_tree, &query.avl, _inmem_stale_cmp);
    if (a) {
        // already exist
        item = _get_entry(a, struct stale_info_commit, avl);
    } else {
        // not exist .. create a new one and insert into tree
        item = (struct stale_info_commit *)calloc(1, sizeof(struct stale_info_commit));
        item->revnum = revnum;
        list_init(&item->doc_list);
        avl_insert(&file->stale_info_tree, &item->avl, _inmem_stale_cmp);
        file->stale_info_tree_loaded.store(true, std::memory_order_relaxed);
    }

    entry = (struct stale_info_entry *)calloc(1, sizeof(struct stale_info_entry));

    if (!system_doc_only) {
#ifdef _DOC_COMP
        if (compress_inmem_stale_info) {
            buflen = snappy_max_compressed_length(doc->length.bodylen);;
            entry->ctx = (void *)calloc(1, buflen);
            int ret = snappy_compress
                      ( (char*)doc->body, doc->length.bodylen,
                        (char*)entry->ctx, &buflen );
            if (ret != 0) {
                fdb_log(NULL, FDB_LOG_ERROR, FDB_RESULT_COMPRESSION_FAIL,
                        "(fdb_add_inmem_stale_info) "
                        "Compression error from a database file '%s'"
                        ": return value %d, header revnum %" _F64 ", "
                        "doc offset %" _F64 "\n",
                        file->filename, ret, revnum, doc_offset);
                if (!a) {
                    // 'item' is allocated in this function call.
                    avl_remove(&file->stale_info_tree, &item->avl);
                    free(item);
                }
                free(entry);
                return;
            }
        } else {
            buflen = doc->length.bodylen;
            entry->ctx = (void *)calloc(1, buflen);
            memcpy(entry->ctx, doc->body, doc->length.bodylen);
        }
#else
        buflen = doc->length.bodylen;
        entry->ctx = (void *)calloc(1, buflen);
        memcpy(entry->ctx, doc->body, doc->length.bodylen);
#endif

        entry->ctxlen = doc->length.bodylen;

    } else {
        // when 'system_doc_only' flag is set, just set to NULL.
        // we need the doc's length and offset info only.
        entry->ctx = NULL;
        entry->ctxlen = 0;
    }

    entry->comp_ctxlen = buflen;
    entry->doclen = _fdb_get_docsize(doc->length);
    entry->offset = doc_offset;
    list_push_back(&item->doc_list, &entry->le);
}